

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source-map.cpp
# Opt level: O2

void __thiscall wasm::SourceMapReader::parse(SourceMapReader *this,Module *wasm)

{
  SourceMapReader *pSVar1;
  bool bVar2;
  int32_t iVar3;
  Ref *pRVar4;
  __shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  size_t sVar6;
  char *pcVar7;
  size_t sVar8;
  string *psVar9;
  ulong uVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  size_t i;
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string_view local_1b0;
  string_view local_1a0;
  string_view local_190;
  string_view local_180;
  string_view local_170;
  string_view local_160;
  string_view local_150;
  string_view local_140;
  string_view local_130;
  string_view local_120;
  string_view local_110;
  string_view local_100;
  string_view local_f0;
  string_view local_e0;
  string_view local_d0;
  string_view local_c0;
  SourceMapReader *local_b0;
  undefined1 local_a8 [8];
  Ref s;
  Ref v_1;
  undefined1 local_80 [8];
  JsonParseException jx;
  Value json;
  undefined1 local_40 [8];
  Ref v;
  
  pcVar7 = (this->buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar7 == (this->buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    return;
  }
  jx.errorText.field_2._8_4_ = 3;
  json.type = String;
  json._4_4_ = 0;
  ::json::Value::parse((Value *)((long)&jx.errorText.field_2 + 8),pcVar7,ASCII);
  if (jx.errorText.field_2._8_4_ != 5) {
    psVar9 = (string *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string<std::allocator<char>>
              (local_310,"Source map is not valid JSON",(allocator<char> *)local_80);
    std::__cxx11::string::string(psVar9,local_310);
    __cxa_throw(psVar9,&MapParseException::typeinfo,MapParseException::~MapParseException);
  }
  IString::IString((IString *)&local_1b0,"version");
  bVar2 = ::json::Value::has((Value *)((long)&jx.errorText.field_2 + 8),(IString)local_1b0);
  if (bVar2) {
    IString::IString((IString *)&local_1a0,"version");
    pRVar4 = ::json::Value::operator[]
                       ((Value *)((long)&jx.errorText.field_2 + 8),(IString)local_1a0);
    if (((pRVar4->super_shared_ptr<json::Value>).
         super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type == Number) {
      IString::IString((IString *)&local_190,"version");
      pRVar4 = ::json::Value::operator[]
                         ((Value *)((long)&jx.errorText.field_2 + 8),(IString)local_190);
      iVar3 = ::json::Value::getInteger
                        ((pRVar4->super_shared_ptr<json::Value>).
                         super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      if (iVar3 == 3) {
        IString::IString((IString *)&local_180,"sources");
        bVar2 = ::json::Value::has((Value *)((long)&jx.errorText.field_2 + 8),(IString)local_180);
        if (bVar2) {
          IString::IString((IString *)&local_170,"sources");
          pRVar4 = ::json::Value::operator[]
                             ((Value *)((long)&jx.errorText.field_2 + 8),(IString)local_170);
          if (((pRVar4->super_shared_ptr<json::Value>).
               super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type == Array) {
            local_b0 = this;
            IString::IString((IString *)&local_160,"sources");
            p_Var5 = (__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2> *)
                     ::json::Value::operator[]
                               ((Value *)((long)&jx.errorText.field_2 + 8),(IString)local_160);
            std::__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2> *)local_a8,p_Var5);
            v_1.super_shared_ptr<json::Value>.
            super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)wasm;
            for (uVar10 = 0; sVar6 = ::json::Value::size((Value *)local_a8), uVar10 < sVar6;
                uVar10 = uVar10 + 1) {
              p_Var5 = (__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2> *)
                       ::json::Value::operator[]((Value *)local_a8,(uint)uVar10);
              std::__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2> *)local_40,p_Var5);
              pRVar4 = ::json::Value::operator[]((Value *)local_a8,(uint)uVar10);
              if (((pRVar4->super_shared_ptr<json::Value>).
                   super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type !=
                  String) {
                psVar9 = (string *)__cxa_allocate_exception(0x20);
                std::__cxx11::string::string<std::allocator<char>>
                          (local_2b0,"Source map sources contains non-string",
                           (allocator<char> *)local_80);
                std::__cxx11::string::string(psVar9,local_2b0);
                __cxa_throw(psVar9,&MapParseException::typeinfo,
                            MapParseException::~MapParseException);
              }
              pcVar7 = ::json::Value::getCString((Value *)local_40);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_80,pcVar7,
                         (allocator<char> *)
                         &s.super_shared_ptr<json::Value>.
                          super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &wasm->debugInfoFileNames,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_80);
              std::__cxx11::string::~string((string *)local_80);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&v);
            }
            IString::IString((IString *)&local_150,"sourcesContent");
            _Var11 = v_1.super_shared_ptr<json::Value>.
                     super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            bVar2 = ::json::Value::has((Value *)((long)&jx.errorText.field_2 + 8),(IString)local_150
                                      );
            if (bVar2) {
              IString::IString((IString *)&local_140,"sourcesContent");
              p_Var5 = (__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2> *)
                       ::json::Value::operator[]
                                 ((Value *)((long)&jx.errorText.field_2 + 8),(IString)local_140);
              std::__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2> *)local_40,p_Var5);
              if (*(Type *)local_40 != Array) {
                psVar9 = (string *)__cxa_allocate_exception(0x20);
                std::__cxx11::string::string<std::allocator<char>>
                          (local_290,"Source map sourcesContent is not an array",
                           (allocator<char> *)local_80);
                std::__cxx11::string::string(psVar9,local_290);
                __cxa_throw(psVar9,&MapParseException::typeinfo,
                            MapParseException::~MapParseException);
              }
              for (uVar10 = 0; sVar6 = ::json::Value::size((Value *)local_40), uVar10 < sVar6;
                  uVar10 = uVar10 + 1) {
                pRVar4 = ::json::Value::operator[]((Value *)local_40,(uint)uVar10);
                pcVar7 = ::json::Value::getCString
                                   ((pRVar4->super_shared_ptr<json::Value>).
                                    super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_80,pcVar7,
                           (allocator<char> *)
                           &s.super_shared_ptr<json::Value>.
                            super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
                ;
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           (_Var11._M_pi + 0x16),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_80);
                std::__cxx11::string::~string((string *)local_80);
              }
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&v);
            }
            IString::IString((IString *)&local_130,"names");
            bVar2 = ::json::Value::has((Value *)((long)&jx.errorText.field_2 + 8),(IString)local_130
                                      );
            if (bVar2) {
              IString::IString((IString *)&local_120,"names");
              p_Var5 = (__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2> *)
                       ::json::Value::operator[]
                                 ((Value *)((long)&jx.errorText.field_2 + 8),(IString)local_120);
              std::__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2> *)local_40,p_Var5);
              if (*(Type *)local_40 != Array) {
                psVar9 = (string *)__cxa_allocate_exception(0x20);
                std::__cxx11::string::string<std::allocator<char>>
                          (local_270,"Source map names is not an array",(allocator<char> *)local_80)
                ;
                std::__cxx11::string::string(psVar9,local_270);
                __cxa_throw(psVar9,&MapParseException::typeinfo,
                            MapParseException::~MapParseException);
              }
              for (uVar10 = 0; sVar6 = ::json::Value::size((Value *)local_40), uVar10 < sVar6;
                  uVar10 = uVar10 + 1) {
                p_Var5 = (__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2> *)
                         ::json::Value::operator[]((Value *)local_40,(uint)uVar10);
                std::__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                          ((__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2> *)
                           &s.super_shared_ptr<json::Value>.
                            super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                           p_Var5);
                if (*(int *)&(s.super_shared_ptr<json::Value>.
                              super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base != 0) {
                  psVar9 = (string *)__cxa_allocate_exception(0x20);
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_250,"Source map names contains non-string",
                             (allocator<char> *)local_80);
                  std::__cxx11::string::string(psVar9,local_250);
                  __cxa_throw(psVar9,&MapParseException::typeinfo,
                              MapParseException::~MapParseException);
                }
                pcVar7 = ::json::Value::getCString
                                   ((Value *)s.super_shared_ptr<json::Value>.
                                             super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount._M_pi);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_80,pcVar7,
                           (allocator<char> *)((long)&json.field_1.str.str._M_str + 7));
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &_Var11._M_pi[0x10]._M_use_count,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_80);
                std::__cxx11::string::~string((string *)local_80);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&v_1);
              }
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&v);
              _Var11 = v_1.super_shared_ptr<json::Value>.
                       super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            }
            IString::IString((IString *)&local_110,"sourceRoot");
            bVar2 = ::json::Value::has((Value *)((long)&jx.errorText.field_2 + 8),(IString)local_110
                                      );
            if (bVar2) {
              IString::IString((IString *)&local_100,"sourceRoot");
              p_Var5 = (__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2> *)
                       ::json::Value::operator[]
                                 ((Value *)((long)&jx.errorText.field_2 + 8),(IString)local_100);
              std::__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2> *)local_80,p_Var5);
              if (*(int *)local_80 != 0) {
                psVar9 = (string *)__cxa_allocate_exception(0x20);
                std::__cxx11::string::string<std::allocator<char>>
                          (local_230,"Source map sourceRoot is not a string",
                           (allocator<char> *)local_40);
                std::__cxx11::string::string(psVar9,local_230);
                __cxa_throw(psVar9,&MapParseException::typeinfo,
                            MapParseException::~MapParseException);
              }
              ::json::Value::getCString((Value *)local_80);
              std::__cxx11::string::assign((char *)(_Var11._M_pi + 0x12));
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&jx);
            }
            IString::IString((IString *)&local_f0,"file");
            bVar2 = ::json::Value::has((Value *)((long)&jx.errorText.field_2 + 8),(IString)local_f0)
            ;
            if (bVar2) {
              IString::IString((IString *)&local_e0,"file");
              p_Var5 = (__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2> *)
                       ::json::Value::operator[]
                                 ((Value *)((long)&jx.errorText.field_2 + 8),(IString)local_e0);
              std::__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2> *)local_80,p_Var5);
              if (*(int *)local_80 != 0) {
                psVar9 = (string *)__cxa_allocate_exception(0x20);
                std::__cxx11::string::string<std::allocator<char>>
                          (local_210,"Source map file is not a string",(allocator<char> *)local_40);
                std::__cxx11::string::string(psVar9,local_210);
                __cxa_throw(psVar9,&MapParseException::typeinfo,
                            MapParseException::~MapParseException);
              }
              ::json::Value::getCString((Value *)local_80);
              std::__cxx11::string::assign((char *)(_Var11._M_pi + 0x14));
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&jx);
            }
            IString::IString((IString *)&local_d0,"mappings");
            bVar2 = ::json::Value::has((Value *)((long)&jx.errorText.field_2 + 8),(IString)local_d0)
            ;
            if (bVar2) {
              IString::IString((IString *)&local_c0,"mappings");
              p_Var5 = (__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2> *)
                       ::json::Value::operator[]
                                 ((Value *)((long)&jx.errorText.field_2 + 8),(IString)local_c0);
              std::__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2> *)local_80,p_Var5);
              if (*(int *)local_80 == 0) {
                pcVar7 = ::json::Value::getCString((Value *)local_80);
                sVar8 = strlen(pcVar7);
                pSVar1 = local_b0;
                (local_b0->mappings)._M_len = sVar8;
                (local_b0->mappings)._M_str = pcVar7;
                if (sVar8 == 0) {
                  sVar6 = 0;
                }
                else {
                  iVar3 = readBase64VLQ(local_b0);
                  sVar6 = (size_t)iVar3;
                }
                pSVar1->location = sVar6;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&jx);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&s);
                ::json::Value::free((Value *)((long)&jx.errorText.field_2 + 8),p_Var5);
                return;
              }
              psVar9 = (string *)__cxa_allocate_exception(0x20);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_1d0,"Source map mappings is not a string",(allocator<char> *)local_40
                        );
              std::__cxx11::string::string(psVar9,local_1d0);
              __cxa_throw(psVar9,&MapParseException::typeinfo,MapParseException::~MapParseException)
              ;
            }
            psVar9 = (string *)__cxa_allocate_exception(0x20);
            std::__cxx11::string::string<std::allocator<char>>
                      (local_1f0,"Source map mappings missing",(allocator<char> *)local_80);
            std::__cxx11::string::string(psVar9,local_1f0);
            __cxa_throw(psVar9,&MapParseException::typeinfo,MapParseException::~MapParseException);
          }
        }
        psVar9 = (string *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_2d0,"Source map sources missing or not an array",
                   (allocator<char> *)local_80);
        std::__cxx11::string::string(psVar9,local_2d0);
        __cxa_throw(psVar9,&MapParseException::typeinfo,MapParseException::~MapParseException);
      }
    }
  }
  psVar9 = (string *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2f0,"Source map version missing or is not 3",(allocator<char> *)local_80);
  std::__cxx11::string::string(psVar9,local_2f0);
  __cxa_throw(psVar9,&MapParseException::typeinfo,MapParseException::~MapParseException);
}

Assistant:

void SourceMapReader::parse(Module& wasm) {
  if (buffer.empty()) {
    return;
  }
  json::Value json;
  try {
    json.parse(buffer.data(), json::Value::ASCII);
  } catch (json::JsonParseException jx) {
    throw MapParseException(jx);
  }
  if (!json.isObject()) {
    throw MapParseException("Source map is not valid JSON");
  }
  if (!(json.has("version") && json["version"]->isNumber() &&
        json["version"]->getInteger() == 3)) {
    throw MapParseException("Source map version missing or is not 3");
  }
  if (!(json.has("sources") && json["sources"]->isArray())) {
    throw MapParseException("Source map sources missing or not an array");
  }
  json::Ref s = json["sources"];
  for (size_t i = 0; i < s->size(); i++) {
    json::Ref v = s[i];
    if (!(s[i]->isString())) {
      throw MapParseException("Source map sources contains non-string");
    }
    wasm.debugInfoFileNames.push_back(v->getCString());
  }

  if (json.has("sourcesContent")) {
    json::Ref sc = json["sourcesContent"];
    if (!sc->isArray()) {
      throw MapParseException("Source map sourcesContent is not an array");
    }
    for (size_t i = 0; i < sc->size(); i++) {
      wasm.debugInfoSourcesContent.push_back(sc[i]->getCString());
    }
  }

  if (json.has("names")) {
    json::Ref n = json["names"];
    if (!n->isArray()) {
      throw MapParseException("Source map names is not an array");
    }
    for (size_t i = 0; i < n->size(); i++) {
      json::Ref v = n[i];
      if (!v->isString()) {
        throw MapParseException("Source map names contains non-string");
      }
      wasm.debugInfoSymbolNames.push_back(v->getCString());
    }
  }

  if (json.has("sourceRoot")) {
    json::Ref sr = json["sourceRoot"];
    if (!sr->isString()) {
      throw MapParseException("Source map sourceRoot is not a string");
    }
    wasm.debugInfoSourceRoot = sr->getCString();
  }

  if (json.has("file")) {
    json::Ref f = json["file"];
    if (!f->isString()) {
      throw MapParseException("Source map file is not a string");
    }
    wasm.debugInfoFile = f->getCString();
  }

  if (!json.has("mappings")) {
    throw MapParseException("Source map mappings missing");
  }
  json::Ref m = json["mappings"];
  if (!m->isString()) {
    throw MapParseException("Source map mappings is not a string");
  }

  mappings = m->getCString();
  if (mappings.empty()) {
    // There are no mappings.
    location = 0;
    return;
  }

  // Read the location of the first debug location.
  location = readBase64VLQ();
}